

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::gather_meshops_arg(int *argc,char **argv)

{
  int iVar1;
  string in_msh;
  string out_geo;
  string arg_check;
  allocator<char> local_119;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58 [2];
  size_type local_48 [2];
  string local_38;
  
  if (*argc < 4) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Error: Incorrect argument count.","");
    print_ln(&local_38);
    local_58[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return;
    }
    goto LAB_0010b63f;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,argv[2],(allocator<char> *)&local_118);
  iVar1 = std::__cxx11::string::compare((char *)local_58);
  if (iVar1 == 0) {
    if (4 < *argc) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,argv[3],(allocator<char> *)&local_f8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,argv[4],&local_119);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_f8,local_f0 + (long)local_f8);
      execute_silver_linings(&local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (local_f8 != local_e8) {
        operator_delete(local_f8,local_e8[0] + 1);
      }
      goto LAB_0010b5c9;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Error: Incorrect argument count.","");
    print_ln(&local_b8);
    local_118._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_0010b61e;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_58);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,argv[3],(allocator<char> *)&local_f8);
      execute_volume_calculator(&local_118);
LAB_0010b5c9:
      local_b8.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p == &local_118.field_2) goto LAB_0010b626;
    }
    else {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Error: Unrecognized meshops argument.","");
      print_ln(&local_d8);
      local_b8.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
      local_118._M_dataplus._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_0010b626;
    }
LAB_0010b61e:
    operator_delete(local_118._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_0010b626:
  local_38.field_2._M_allocated_capacity = local_48[0];
  if (local_58[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48) {
    return;
  }
LAB_0010b63f:
  operator_delete(local_58[0],local_38.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void UI::gather_meshops_arg(int &argc, char *argv[])
{
    if (argc > 3)
    {
        std::string arg_check = argv[2];
        if (arg_check=="-s")
        {
            if (argc>4)
            {
                std::string in_msh = argv[3], out_geo = argv[4];
                execute_silver_linings(in_msh,  out_geo);
            }
            else
            {
                print_ln("Error: Incorrect argument count.");
            }
        }
        else if(arg_check=="-v")
        {
            std::string in_msh = argv[3];
            execute_volume_calculator(in_msh);
        }
        else
        {
            print_ln("Error: Unrecognized meshops argument.");
        }
    }
    else
    {
        print_ln("Error: Incorrect argument count.");
    }
}